

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

void __thiscall Fl_Shared_Image::update(Fl_Shared_Image *this)

{
  int iVar1;
  char **p;
  Fl_Shared_Image *this_local;
  
  if (this->image_ != (Fl_Image *)0x0) {
    iVar1 = Fl_Image::w(this->image_);
    Fl_Image::w(&this->super_Fl_Image,iVar1);
    iVar1 = Fl_Image::h(this->image_);
    Fl_Image::h(&this->super_Fl_Image,iVar1);
    iVar1 = Fl_Image::d(this->image_);
    Fl_Image::d(&this->super_Fl_Image,iVar1);
    p = Fl_Image::data(this->image_);
    iVar1 = Fl_Image::count(this->image_);
    Fl_Image::data(&this->super_Fl_Image,p,iVar1);
  }
  return;
}

Assistant:

void
Fl_Shared_Image::update() {
  if (image_) {
    w(image_->w());
    h(image_->h());
    d(image_->d());
    data(image_->data(), image_->count());
  }
}